

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
* getReadWriteFile(ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                   *__return_storage_ptr__,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
                  uint64_t Offset)

{
  bool bVar1;
  file_type fVar2;
  MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer> *this;
  error_code eVar3;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  NamedBufferAlloc local_e8;
  unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
  local_e0;
  unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
  Result;
  file_type Type;
  undefined1 local_b0 [8];
  error_code EC_1;
  file_status Status;
  undefined1 local_48 [8];
  error_code EC;
  int FD;
  uint64_t Offset_local;
  uint64_t MapSize_local;
  uint64_t FileSize_local;
  Twine *Filename_local;
  
  eVar3 = llvm::sys::fs::openFileForReadWrite
                    (Filename,(int *)((long)&EC._M_cat + 4),CD_OpenExisting,F_None,0x1b6);
  EC._0_8_ = eVar3._M_cat;
  local_48._0_4_ = eVar3._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if (bVar1) {
    eVar3._4_4_ = 0;
    eVar3._M_value = local_48._0_4_;
    eVar3._M_cat = (error_category *)EC._0_8_;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,eVar3);
    return __return_storage_ptr__;
  }
  Offset_local = MapSize;
  if (MapSize == 0xffffffffffffffff) {
    MapSize_local = FileSize;
    if (FileSize == 0xffffffffffffffff) {
      llvm::sys::fs::file_status::file_status((file_status *)&EC_1._M_cat);
      eVar3 = llvm::sys::fs::status(EC._M_cat._4_4_,(file_status *)&EC_1._M_cat);
      EC_1._0_8_ = eVar3._M_cat;
      local_b0._0_4_ = eVar3._M_value;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_b0);
      if (bVar1) {
        EC_00._4_4_ = 0;
        EC_00._M_value = local_b0._0_4_;
        EC_00._M_cat = (error_category *)EC_1._0_8_;
        llvm::
        ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
        ::ErrorOr(__return_storage_ptr__,EC_00);
        return __return_storage_ptr__;
      }
      fVar2 = llvm::sys::fs::basic_file_status::type((basic_file_status *)&EC_1._M_cat);
      if ((fVar2 != regular_file) && (fVar2 != block_file)) {
        eVar3 = llvm::make_error_code(invalid_argument);
        EC_01._M_cat = eVar3._M_cat;
        Result._M_t.
        super___uniq_ptr_impl<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
        ._M_t.
        super__Tuple_impl<0UL,_llvm::WriteThroughMemoryBuffer_*,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
        .super__Head_base<0UL,_llvm::WriteThroughMemoryBuffer_*,_false>._M_head_impl._0_4_ =
             eVar3._M_value;
        EC_01._4_4_ = 0;
        EC_01._M_value =
             (uint)Result._M_t.
                   super___uniq_ptr_impl<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::WriteThroughMemoryBuffer_*,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
                   .super__Head_base<0UL,_llvm::WriteThroughMemoryBuffer_*,_false>._M_head_impl;
        llvm::
        ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
        ::ErrorOr(__return_storage_ptr__,EC_01);
        return __return_storage_ptr__;
      }
      MapSize_local = llvm::sys::fs::basic_file_status::getSize((basic_file_status *)&EC_1._M_cat);
    }
    Offset_local = MapSize_local;
  }
  anon_unknown.dwarf_14c286::NamedBufferAlloc::NamedBufferAlloc(&local_e8,Filename);
  this = (MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer> *)operator_new(0x30,&local_e8);
  anon_unknown.dwarf_14c286::MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer>::
  MemoryBufferMMapFile(this,false,EC._M_cat._4_4_,Offset_local,Offset,(error_code *)local_48);
  std::
  unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>::
  unique_ptr<std::default_delete<llvm::WriteThroughMemoryBuffer>,void>
            ((unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>
              *)&local_e0,(pointer)this);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if (bVar1) {
    EC_02._4_4_ = 0;
    EC_02._M_value = local_48._0_4_;
    EC_02._M_cat = (error_category *)EC._0_8_;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,EC_02);
  }
  else {
    llvm::
    ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
    ::
    ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
                *)__return_storage_ptr__,&local_e0,(type *)0x0);
  }
  std::
  unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>::
  ~unique_ptr(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WriteThroughMemoryBuffer>>
getReadWriteFile(const Twine &Filename, uint64_t FileSize, uint64_t MapSize,
                 uint64_t Offset) {
  int FD;
  std::error_code EC = sys::fs::openFileForReadWrite(
      Filename, FD, sys::fs::CD_OpenExisting, sys::fs::OF_None);

  if (EC)
    return EC;

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't mmap it, so error out.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return make_error_code(errc::invalid_argument);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  std::unique_ptr<WriteThroughMemoryBuffer> Result(
      new (NamedBufferAlloc(Filename))
          MemoryBufferMMapFile<WriteThroughMemoryBuffer>(false, FD, MapSize,
                                                         Offset, EC));
  if (EC)
    return EC;
  return std::move(Result);
}